

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O3

ImageT<unsigned_short,_2U> * __thiscall
ImageT<unsigned_short,_2U>::normalize(ImageT<unsigned_short,_2U> *this)

{
  Color CVar1;
  Color *pCVar2;
  uint uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  vec3<unsigned_short> local_38;
  
  uVar3 = (this->super_Image).height * (this->super_Image).width;
  if (uVar3 != 0) {
    uVar4 = 0;
    do {
      pCVar2 = this->pixels;
      CVar1.field_0 =
           (anon_union_4_2_6556a7fb_for_color<unsigned_short,_2U>_3)
           *(anon_union_4_2_6556a7fb_for_color<unsigned_short,_2U>_3 *)
            &pCVar2[uVar4].field_0.field_1;
      auVar5._6_10_ = SUB1610(ZEXT816(0) << 0x40,6);
      auVar5._4_2_ = CVar1.field_0._2_2_;
      auVar5._0_4_ = CVar1.field_0;
      local_38.super_vec3_base.r = (float)((uint)CVar1.field_0 & 0xffff);
      local_38.super_vec3_base.g = (float)auVar5._4_4_;
      local_38.super_vec3_base.b = 32767.5;
      vec3<unsigned_short>::normalize(&local_38);
      pCVar2[uVar4].field_0.comps[0] = (unsigned_short)(int)local_38.super_vec3_base.r;
      pCVar2[uVar4].field_0.comps[1] = (unsigned_short)(int)local_38.super_vec3_base.g;
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  return this;
}

Assistant:

virtual ImageT& normalize() override {
        uint32_t pixelCount = getPixelCount();
        for (uint32_t i = 0; i < pixelCount; ++i) {
            Color& c = pixels[i];
            c.normalize();
        }
        return *this;
    }